

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)17>_> *
vkt::api::anon_unknown_1::RenderPass::create
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *param_3)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 *puVar3;
  VkAttachmentDescription *pVVar4;
  VkAttachmentReference dsAttachment;
  VkAttachmentReference colorAttachments [1];
  VkRenderPassCreateInfo renderPassInfo;
  VkSubpassDescription subpasses [1];
  VkAttachmentDescription attachments [2];
  VkAttachmentReference local_f8;
  VkAttachmentReference local_f0;
  VkRenderPassCreateInfo local_e8;
  VkSubpassDescription local_a8;
  VkAttachmentDescription local_58 [2];
  
  local_a8.pDepthStencilAttachment = &local_f8;
  local_e8.pAttachments = local_58;
  puVar3 = &DAT_00accf30;
  pVVar4 = local_e8.pAttachments;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *puVar3;
    pVVar4->flags = (int)uVar1;
    pVVar4->format = (int)((ulong)uVar1 >> 0x20);
    puVar3 = puVar3 + 1;
    pVVar4 = (VkAttachmentDescription *)&pVVar4->samples;
  }
  local_a8.pColorAttachments = &local_f0;
  local_f0.attachment = 0;
  local_f0.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_f8.attachment = 1;
  local_f8.layout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  local_e8.pSubpasses = &local_a8;
  local_a8.flags = 0;
  local_a8.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_a8.inputAttachmentCount = 0;
  local_a8.pInputAttachments = (VkAttachmentReference *)0x0;
  local_a8.colorAttachmentCount = 1;
  local_a8.pResolveAttachments = (VkAttachmentReference *)0x0;
  local_a8.preserveAttachmentCount = 0;
  local_a8.pPreserveAttachments = (deUint32 *)0x0;
  local_e8.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_e8.pNext = (void *)0x0;
  local_e8.flags = 0;
  local_e8.attachmentCount = 2;
  local_e8.subpassCount = 1;
  local_e8.dependencyCount = 0;
  local_e8.pDependencies = (VkSubpassDependency *)0x0;
  ::vk::createRenderPass
            (__return_storage_ptr__,env->vkd,env->device,&local_e8,env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkRenderPass> create (const Environment& env, const Resources&, const Parameters&)
	{
		const VkAttachmentDescription	attachments[]		=
		{
			{
				(VkAttachmentDescriptionFlags)0,
				VK_FORMAT_R8G8B8A8_UNORM,
				VK_SAMPLE_COUNT_1_BIT,
				VK_ATTACHMENT_LOAD_OP_CLEAR,
				VK_ATTACHMENT_STORE_OP_STORE,
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,
				VK_ATTACHMENT_STORE_OP_DONT_CARE,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			},
			{
				(VkAttachmentDescriptionFlags)0,
				VK_FORMAT_D16_UNORM,
				VK_SAMPLE_COUNT_1_BIT,
				VK_ATTACHMENT_LOAD_OP_CLEAR,
				VK_ATTACHMENT_STORE_OP_DONT_CARE,
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,
				VK_ATTACHMENT_STORE_OP_DONT_CARE,
				VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
				VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
			}
		};
		const VkAttachmentReference		colorAttachments[]	=
		{
			{
				0u,											// attachment
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			}
		};
		const VkAttachmentReference		dsAttachment		=
		{
			1u,											// attachment
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL
		};
		const VkSubpassDescription		subpasses[]			=
		{
			{
				(VkSubpassDescriptionFlags)0,
				VK_PIPELINE_BIND_POINT_GRAPHICS,
				0u,											// inputAttachmentCount
				DE_NULL,									// pInputAttachments
				DE_LENGTH_OF_ARRAY(colorAttachments),
				colorAttachments,
				DE_NULL,									// pResolveAttachments
				&dsAttachment,
				0u,											// preserveAttachmentCount
				DE_NULL,									// pPreserveAttachments
			}
		};
		const VkRenderPassCreateInfo	renderPassInfo		=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,
			DE_NULL,
			(VkRenderPassCreateFlags)0,
			DE_LENGTH_OF_ARRAY(attachments),
			attachments,
			DE_LENGTH_OF_ARRAY(subpasses),
			subpasses,
			0u,												// dependencyCount
			DE_NULL											// pDependencies
		};

		return createRenderPass(env.vkd, env.device, &renderPassInfo, env.allocationCallbacks);
	}